

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O2

sFace * __thiscall gjkepa2_impl::EPA::findbest(EPA *this)

{
  sFace *psVar1;
  sFace *psVar2;
  float fVar3;
  float fVar4;
  
  psVar2 = (this->m_hull).root;
  psVar1 = psVar2;
  fVar3 = psVar2->d * psVar2->d;
  while (psVar2 = psVar2->l[1], psVar2 != (sFace *)0x0) {
    fVar4 = psVar2->d * psVar2->d;
    if (fVar4 < fVar3) {
      psVar1 = psVar2;
      fVar3 = fVar4;
    }
  }
  return psVar1;
}

Assistant:

sFace*				findbest()
			{
				sFace*		minf=m_hull.root;
				btScalar	mind=minf->d*minf->d;
				for(sFace* f=minf->l[1];f;f=f->l[1])
				{
					const btScalar	sqd=f->d*f->d;
					if(sqd<mind)
					{
						minf=f;
						mind=sqd;
					}
				}
				return(minf);
			}